

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Value::operator*(Value *this,Value *rhs)

{
  bool bVar1;
  string *in_RSI;
  Value *in_RDI;
  Value *this_00;
  int64_t n;
  int64_t i;
  ostringstream out;
  double *in_stack_fffffffffffffdc8;
  Value *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffe00;
  Value *in_stack_fffffffffffffe08;
  string local_1f0 [16];
  Value *in_stack_fffffffffffffe20;
  string local_1d0 [48];
  long local_1a0;
  long local_198;
  ostringstream local_190 [400];
  
  bVar1 = is_string((Value *)0x30b16e);
  if ((bVar1) && (bVar1 = is_number_integer((Value *)0x30b184), bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    local_198 = 0;
    local_1a0 = get<long>(in_stack_fffffffffffffe20);
    for (; local_198 < local_1a0; local_198 = local_198 + 1) {
      to_str_abi_cxx11_(in_stack_fffffffffffffe08);
      std::operator<<((ostream *)local_190,local_1d0);
      std::__cxx11::string::~string(local_1d0);
    }
    std::__cxx11::ostringstream::str();
    Value(in_stack_fffffffffffffe00,in_RSI);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    bVar1 = is_number_integer((Value *)0x30b2cf);
    if ((bVar1) && (bVar1 = is_number_integer((Value *)0x30b2e2), bVar1)) {
      get<long>(in_stack_fffffffffffffe20);
      get<long>(in_stack_fffffffffffffe20);
      Value(in_stack_fffffffffffffdd0,(int64_t *)in_stack_fffffffffffffdc8);
    }
    else {
      this_00 = (Value *)get<double>(in_stack_fffffffffffffe20);
      get<double>(in_stack_fffffffffffffe20);
      Value(this_00,in_stack_fffffffffffffdc8);
    }
  }
  return in_RDI;
}

Assistant:

Value operator*(const Value& rhs) const {
      if (is_string() && rhs.is_number_integer()) {
        std::ostringstream out;
        for (int64_t i = 0, n = rhs.get<int64_t>(); i < n; ++i) {
          out << to_str();
        }
        return out.str();
      }
      else if (is_number_integer() && rhs.is_number_integer())
        return get<int64_t>() * rhs.get<int64_t>();
      else
        return get<double>() * rhs.get<double>();
  }